

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_8::TileBufferTask::execute(TileBufferTask_conflict *this)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  value_type pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  uint *puVar10;
  int *piVar11;
  size_type sVar12;
  reference ppTVar13;
  Compressor *pCVar14;
  ostream *poVar15;
  InputExc *this_00;
  ulong uVar16;
  ptrdiff_t unaff_RBX;
  long in_RDI;
  ptrdiff_t unaff_R12;
  char *unaff_R13;
  char *unaff_R14;
  char **unaff_R15;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  ptrdiff_t in_stack_00000030;
  ptrdiff_t in_stack_00000038;
  ptrdiff_t in_stack_00000040;
  Format in_stack_00000050;
  PixelType in_stack_00000058;
  PixelType in_stack_00000060;
  exception *e;
  int yOffsetForSampleCount;
  int xOffsetForSampleCount;
  int yOffsetForData;
  int xOffsetForData;
  TInSliceInfo_conflict *slice;
  uint i;
  int y_1;
  char *readPtr;
  stringstream _iex_throw_s;
  uint c;
  int count;
  int yOffset;
  int xOffset;
  int x;
  int bytesPerLine;
  int y;
  int maxBytesPerTileLine;
  int sizeOfTile;
  Array<unsigned_int> numPixelsPerScanLine;
  Box2i tileRange;
  int in_stack_fffffffffffffc5c;
  int iVar17;
  PixelType in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  ptrdiff_t in_stack_fffffffffffffc88;
  char **in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  size_t in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  Compression c_00;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd08;
  uint local_238;
  int local_234;
  stringstream local_228 [16];
  ostream local_218 [380];
  undefined1 local_9c [16];
  uint local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  Array<unsigned_int> local_68 [2];
  int local_48;
  int local_44;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  long lVar19;
  
  lVar19 = *(long *)(in_RDI + 0x18);
  iVar9 = *(int *)(lVar19 + 0x44);
  iVar17 = *(int *)(lVar19 + 0x48);
  uVar8 = *(undefined4 *)(lVar19 + 0x4c);
  uVar18 = *(undefined4 *)(lVar19 + 0x50);
  lVar19 = in_RDI;
  dataWindowForTile((TileDescription *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                    ,in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0,
                    (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(int)in_stack_fffffffffffffcc8,
                    in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,
                    in_stack_fffffffffffffd08);
  Array<unsigned_int>::Array(local_68);
  Array<unsigned_int>::resizeErase
            ((Array<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc74,uVar18),
             CONCAT44(in_stack_fffffffffffffc6c,uVar8));
  local_6c = 0;
  local_70 = 0;
  for (local_74 = local_44; c_00 = (Compression)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
      local_74 <= in_stack_ffffffffffffffc4; local_74 = local_74 + 1) {
    puVar10 = Array::operator_cast_to_unsigned_int_((Array *)local_68);
    puVar10[local_74 - local_44] = 0;
    local_78 = 0;
    for (local_7c = local_48; local_7c <= in_stack_ffffffffffffffc0; local_7c = local_7c + 1) {
      local_80 = *(int *)(*(long *)(in_RDI + 0x10) + 0x1a8) * local_48;
      local_84 = *(int *)(*(long *)(in_RDI + 0x10) + 0x1ac) * local_44;
      piVar11 = DeepTiledInputFile::Data::getSampleCount
                          ((Data *)CONCAT44(in_stack_fffffffffffffc64,iVar17),
                           in_stack_fffffffffffffc5c,iVar9);
      local_88 = *piVar11;
      for (local_8c = 0; uVar16 = (ulong)local_8c,
          sVar12 = std::
                   vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   ::size((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                           *)(*(long *)(in_RDI + 0x10) + 0x140)), iVar7 = local_88, uVar16 < sVar12;
          local_8c = local_8c + 1) {
        ppTVar13 = std::
                   vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                 *)(*(long *)(in_RDI + 0x10) + 0x140),(ulong)local_8c);
        iVar7 = local_88;
        if (((*ppTVar13)->fill & 1U) == 0) {
          std::
          vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
          ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                        *)(*(long *)(in_RDI + 0x10) + 0x140),(ulong)local_8c);
          iVar6 = pixelTypeSize(in_stack_fffffffffffffc64);
          iVar5 = local_88;
          local_6c = local_6c + iVar7 * iVar6;
          std::
          vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
          ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                        *)(*(long *)(in_RDI + 0x10) + 0x140),(ulong)local_8c);
          iVar7 = pixelTypeSize(in_stack_fffffffffffffc64);
          local_78 = iVar5 * iVar7 + local_78;
        }
      }
      puVar10 = Array::operator_cast_to_unsigned_int_((Array *)local_68);
      puVar10[local_74 - local_44] = iVar7 + puVar10[local_74 - local_44];
    }
    if (local_70 < local_78) {
      local_70 = local_78;
    }
  }
  if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x38) != 0) &&
     (plVar1 = *(long **)(*(long *)(in_RDI + 0x18) + 0x38), plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 8))();
  }
  Header::compression((Header *)0x1d5703);
  pCVar14 = newTileCompressor(c_00,in_stack_fffffffffffffcc0,
                              CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                              (Header *)
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  *(Compressor **)(*(long *)(in_RDI + 0x18) + 0x38) = pCVar14;
  if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x38) == 0) ||
     ((ulong)(long)local_6c <= *(ulong *)(*(long *)(in_RDI + 0x18) + 0x28))) {
    *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x40) = 1;
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18) =
         *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20);
  }
  else {
    uVar8 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x18) + 0x38) + 0x18))();
    *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x40) = uVar8;
    lVar2 = *(long *)(in_RDI + 0x18);
    plVar1 = *(long **)(lVar2 + 0x38);
    uVar3 = *(undefined8 *)(lVar2 + 0x20);
    uVar8 = *(undefined4 *)(lVar2 + 0x28);
    Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
              ((Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffc64,iVar17),
               (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffc5c,iVar9));
    iVar9 = (**(code **)(*plVar1 + 0x38))
                      (plVar1,uVar3,uVar8,local_9c,*(long *)(in_RDI + 0x18) + 0x18);
    *(long *)(*(long *)(in_RDI + 0x18) + 0x28) = (long)iVar9;
  }
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0x28) != (long)local_6c) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_228);
    poVar15 = std::operator<<(local_218,"size mismatch when reading deep tile: expected ");
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_6c);
    poVar15 = std::operator<<(poVar15,"bytes of uncompressed data but got ");
    std::ostream::operator<<(poVar15,*(ulong *)(*(long *)(in_RDI + 0x18) + 0x28));
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(this_00,local_228);
    __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  for (local_234 = local_44; local_234 <= in_stack_ffffffffffffffc4; local_234 = local_234 + 1) {
    local_238 = 0;
    while( true ) {
      uVar16 = (ulong)local_238;
      sVar12 = std::
               vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               ::size((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                       *)(*(long *)(in_RDI + 0x10) + 0x140));
      if (sVar12 <= uVar16) break;
      ppTVar13 = std::
                 vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                               *)(*(long *)(in_RDI + 0x10) + 0x140),(ulong)local_238);
      pTVar4 = *ppTVar13;
      iVar9 = local_44;
      if (pTVar4->yTileCoords == 0) {
        iVar9 = 0;
      }
      if ((pTVar4->skip & 1U) == 0) {
        in_stack_fffffffffffffc88 = pTVar4->sampleStride;
        in_stack_fffffffffffffc90 = (char **)pTVar4->xStride;
        iVar7 = in_stack_ffffffffffffffc0;
        copyIntoDeepFrameBuffer
                  (unaff_R15,unaff_R14,unaff_R13,unaff_R12,unaff_RBX,(int)((ulong)lVar19 >> 0x20),
                   unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                   in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
                   in_stack_00000040,SUB81((ulong)lVar19 >> 0x18,0),
                   (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_00000050,in_stack_00000058,in_stack_00000060);
      }
      else {
        Array::operator_cast_to_unsigned_int_((Array *)local_68);
        iVar7 = in_stack_ffffffffffffffc0;
        skipChannel(in_stack_fffffffffffffc90,(PixelType)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        in_stack_ffffffffffffffc0 = iVar17;
        iVar9 = in_stack_fffffffffffffc80;
      }
      local_238 = local_238 + 1;
      iVar17 = in_stack_ffffffffffffffc0;
      in_stack_fffffffffffffc80 = iVar9;
      in_stack_ffffffffffffffc0 = iVar7;
    }
  }
  Array<unsigned_int>::~Array((Array<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc64,iVar17));
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                _ifd->tileDesc,
                _ifd->minX, _ifd->maxX,
                _ifd->minY, _ifd->maxY,
                _tileBuffer->dx,
                _tileBuffer->dy,
                _tileBuffer->lx,
                _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase(tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount(x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size(); ++c)
                {
                    // This slice does not exist in the file.
                    if ( !_ifd->slices[c]->fill)
                    {
                          sizeOfTile += count * pixelTypeSize(_ifd->slices[c]->typeInFile);
                          bytesPerLine += count * pixelTypeSize(_ifd->slices[c]->typeInFile);     
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0)
            delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor
                                  (_ifd->header.compression(),
                                   maxBytesPerTileLine,
                                   _ifd->tileDesc.ySize,
                                   _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor && _tileBuffer->dataSize < static_cast<Int64>(sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile
                (_tileBuffer->buffer, _tileBuffer->dataSize,
                 tileRange, _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

	//
	// sanity check data size: the uncompressed data should be exactly 
	// 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
	//
        if (_tileBuffer->dataSize != static_cast<Int64>(sizeOfTile))
	{
		THROW (IEX_NAMESPACE::InputExc, "size mismatch when reading deep tile: expected " << sizeOfTile << "bytes of uncompressed data but got " << _tileBuffer->dataSize);
	}

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char *readPtr = _tileBuffer->uncompressedData;
                                                        // points to where we
                                                        // read from in the
                                                        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                TInSliceInfo &slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0 : tileRange.min.y;
                int xOffsetForSampleCount =
                        (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                        (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (readPtr, slice.typeInFile,
                                 numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (readPtr, slice.pointerArrayBase,
                                             _ifd->sampleCountSliceBase,
                                             _ifd->sampleCountXStride,
                                             _ifd->sampleCountYStride,
                                             y,
                                             tileRange.min.x,
                                             tileRange.max.x,
                                             xOffsetForSampleCount, yOffsetForSampleCount,
                                             xOffsetForData, yOffsetForData,
                                             slice.sampleStride, 
                                             slice.xStride,
                                             slice.yStride,
                                             slice.fill,
                                             slice.fillValue, _tileBuffer->format,
                                             slice.typeInFrameBuffer,
                                             slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}